

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O3

void __thiscall
icu_63::ChineseCalendar::roll
          (ChineseCalendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  uint uVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  if (field != UCAL_MONTH) {
    Calendar::roll(&this->super_Calendar,field,amount,status);
    return;
  }
  if ((((amount != 0) &&
       (uVar1 = Calendar::get(&this->super_Calendar,UCAL_DATE,status),
       *status < U_ILLEGAL_ARGUMENT_ERROR)) &&
      (iVar2 = Calendar::get(&this->super_Calendar,UCAL_JULIAN_DAY,status),
      *status < U_ILLEGAL_ARGUMENT_ERROR)) &&
     (iVar3 = Calendar::get(&this->super_Calendar,UCAL_MONTH,status),
     *status < U_ILLEGAL_ARGUMENT_ERROR)) {
    uVar6 = (iVar2 - uVar1) - 0x253d8b;
    if ((this->super_Calendar).field_0x262 == '\0') {
      uVar4 = 0xc;
    }
    else {
      iVar2 = Calendar::get(&this->super_Calendar,UCAL_IS_LEAP_MONTH,status);
      uVar4 = 1;
      if (iVar2 != 1) {
        uVar4 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                          ((double)(int)(uVar6 - (int)(((double)iVar3 + -0.5) * 29.530588853)),this,
                           1);
        iVar5 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x37])
                          (this,(ulong)uVar4,(ulong)uVar6);
        uVar4 = (uint)((char)iVar5 != '\0');
      }
      if (U_ZERO_ERROR < *status) {
        return;
      }
      iVar3 = iVar3 + uVar4;
      uVar4 = 0xd - ((this->super_Calendar).field_0x262 == '\0');
    }
    iVar5 = (amount + iVar3) % (int)uVar4;
    if ((iVar5 >> 0x1f & uVar4) + iVar5 != iVar3) {
      (*(this->super_Calendar).super_UObject._vptr_UObject[0x3a])(this,(ulong)uVar6,(ulong)uVar1);
      return;
    }
  }
  return;
}

Assistant:

void ChineseCalendar::roll(UCalendarDateFields field, int32_t amount, UErrorCode& status) {
    switch (field) {
    case UCAL_MONTH:
        if (amount != 0) {
            int32_t dom = get(UCAL_DAY_OF_MONTH, status);
            if (U_FAILURE(status)) break;
            int32_t day = get(UCAL_JULIAN_DAY, status) - kEpochStartAsJulianDay; // Get local day
            if (U_FAILURE(status)) break;
            int32_t moon = day - dom + 1; // New moon (start of this month)

            // Note throughout the following:  Months 12 and 1 are never
            // followed by a leap month (D&R p. 185).

            // Compute the adjusted month number m.  This is zero-based
            // value from 0..11 in a non-leap year, and from 0..12 in a
            // leap year.
            int32_t m = get(UCAL_MONTH, status); // 0-based month
            if (U_FAILURE(status)) break;
            if (isLeapYear) { // (member variable)
                if (get(UCAL_IS_LEAP_MONTH, status) == 1) {
                    ++m;
                } else {
                    // Check for a prior leap month.  (In the
                    // following, month 0 is the first month of the
                    // year.)  Month 0 is never followed by a leap
                    // month, and we know month m is not a leap month.
                    // moon1 will be the start of month 0 if there is
                    // no leap month between month 0 and month m;
                    // otherwise it will be the start of month 1.
                    int moon1 = moon -
                        (int) (CalendarAstronomer::SYNODIC_MONTH * (m - 0.5));
                    moon1 = newMoonNear(moon1, TRUE);
                    if (isLeapMonthBetween(moon1, moon)) {
                        ++m;
                    }
                }
                if (U_FAILURE(status)) break;
            }

            // Now do the standard roll computation on m, with the
            // allowed range of 0..n-1, where n is 12 or 13.
            int32_t n = isLeapYear ? 13 : 12; // Months in this year
            int32_t newM = (m + amount) % n;
            if (newM < 0) {
                newM += n;
            }

            if (newM != m) {
                offsetMonth(moon, dom, newM - m);
            }
        }
        break;
    default:
        Calendar::roll(field, amount, status);
        break;
    }
}